

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm_writer.cpp
# Opt level: O3

void __thiscall diffusion::ShmWriter::cyclic_write(ShmWriter *this,char *data,size_t size)

{
  uint32_t uVar1;
  int iVar2;
  uint32_t uVar3;
  int iVar4;
  size_t sVar5;
  
  if (0 < (int)size) {
    uVar1 = this->shm_body_size_;
    uVar3 = this->writer_shm_body_offset_;
    sVar5 = size;
    do {
      iVar4 = (int)sVar5;
      iVar2 = uVar1 - uVar3;
      if (iVar4 < (int)(uVar1 - uVar3)) {
        iVar2 = iVar4;
      }
      memcpy(this->shm_body_position_ + (int)uVar3,data + (size - (sVar5 & 0xffffffff)),(long)iVar2)
      ;
      uVar3 = this->writer_shm_body_offset_ + iVar2;
      uVar1 = this->shm_body_size_;
      if (uVar3 == uVar1) {
        uVar3 = 0;
      }
      this->writer_shm_body_offset_ = uVar3;
      sVar5 = (size_t)(uint)(iVar4 - iVar2);
    } while (iVar4 - iVar2 != 0 && iVar2 <= iVar4);
  }
  return;
}

Assistant:

void ShmWriter::cyclic_write(char const *data, std::size_t size) {
    auto bytes_left = static_cast<Size>(size);
    while (bytes_left > 0) {
        auto start_position_unwritten_bytes = data + size - bytes_left;
        auto space_left = shm_body_size_ - static_cast<Size>(writer_shm_body_offset_);
        auto bytes_can_be_written_without_wrap = (bytes_left > space_left) ? space_left : bytes_left;
        std::memcpy(shm_body_position_ + static_cast<Offset>(writer_shm_body_offset_), start_position_unwritten_bytes, bytes_can_be_written_without_wrap);
        writer_shm_body_offset_ += bytes_can_be_written_without_wrap;
        bytes_left -= bytes_can_be_written_without_wrap;
        if (static_cast<Size>(writer_shm_body_offset_) == shm_body_size_) {
            writer_shm_body_offset_ = 0;
        }
    }
}